

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_ineq.h
# Opt level: O0

void __thiscall
mp::
Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>
::ConvertCtxPos(Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                *this,ItemType *cc,int param_3)

{
  double eps_output;
  int kind_output;
  double in_stack_000009c8;
  int in_stack_000009d4;
  ItemType *in_stack_000009d8;
  Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_000009e0;
  
  ConvertCondIneq<_1>(in_stack_000009e0,in_stack_000009d8,in_stack_000009d4,in_stack_000009c8);
  return;
}

Assistant:

void ConvertCtxPos(const ItemType& cc, int ) {
    constexpr auto kind_output =               // output comparison is <= or >=
        ( kind_input>0 ) ? 1 : -1;             // even for < or >
    auto eps_output =
        ( kind_input==1 || kind_input==-1 ) ?  // non-strict comparison?
          0.0 :
          kind_output *
            GetMC().ComparisonEps(   // 1 for integer expressions
              GetMC().ComputeBoundsAndType(cc.GetArguments()).
              get_result_type() );
    ConvertCondIneq<kind_output>(cc, 1, eps_output);
  }